

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O1

string * __thiscall
glcts::GetDef2DVtxSrc_abi_cxx11_(string *__return_storage_ptr__,glcts *this,GLSLVersion glslVersion)

{
  char *__s;
  size_t sVar1;
  stringstream str;
  stringstream asStack_1a8 [16];
  undefined1 local_198 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  __s = glu::getGLSLVersionDeclaration((GLSLVersion)this);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(ostream *)local_198 + (int)*(_func_int **)(local_198._0_8_ + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "in highp vec2 aPos;\nvoid main() {\n   gl_Position = vec4(aPos, 0.0, 1.0);\n}\n",0x4b)
  ;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

static std::string GetDef2DVtxSrc(glu::GLSLVersion glslVersion)
{
	std::stringstream str;

	DE_ASSERT(glslVersion == glu::GLSL_VERSION_310_ES || glslVersion >= glu::GLSL_VERSION_430);

	str << glu::getGLSLVersionDeclaration(glslVersion) << "\n"
		<< "in highp vec2 aPos;\n"
		   "void main() {\n"
		   "   gl_Position = vec4(aPos, 0.0, 1.0);\n"
		   "}\n";
	return str.str();
}